

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

void * memchr(void *__s,int __c,size_t __n)

{
  ulong local_40;
  size_t i;
  uchar c_;
  uchar *s_;
  size_t n_local;
  int c_local;
  void *s_local;
  
  local_40 = 0;
  while( true ) {
    if (__n <= local_40) {
      return (void *)0x0;
    }
    if (*(char *)((long)__s + local_40) == (char)__c) break;
    local_40 = local_40 + 1;
  }
  return (void *)((long)__s + local_40);
}

Assistant:

void *memchr(const void *s, int c, size_t n) {
    const unsigned char *s_ = s;
    const unsigned char c_ = (unsigned char)c;

    for (size_t i = 0; i < n; ++i) {
        if (s_[i] == c_) {
            return (void *)(s_ + i);
        }
    }

    return NULL;
}